

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbgtool.c
# Opt level: O1

void nts(frameex1 *fxp)

{
  uint uVar1;
  
  if ((fxp->field_0x3 & 2) == 0) {
    uVar1 = fxp->fnheader;
  }
  else {
    uVar1 = fxp->nametable;
  }
  if ((uVar1 & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar1);
  }
  ntheader((fnhead *)(Lisp_world + uVar1));
  return;
}

Assistant:

void nts(struct frameex1 *fxp) {
  struct fnhead *nt;

#ifdef BIGVM
  if (fxp->validnametable)
    nt = (struct fnhead *)NativeAligned4FromLAddr(fxp->nametable);
  else
    nt = (struct fnhead *)NativeAligned4FromLAddr(fxp->fnheader);
#else
  if (fxp->validnametable)
    nt = (struct fnhead *)NativeAligned4FromLAddr(((fxp->hi2nametable) << 16 | fxp->lonametable));
  else
    nt = (struct fnhead *)NativeAligned4FromLAddr(((fxp->hi2fnheader) << 16 | fxp->lofnheader));
#endif /* BIGVM */
  ntheader(nt);
}